

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderTextureFunctionTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles3::Functional::TextureSizeCase::genFragmentShader_abi_cxx11_
          (string *__return_storage_ptr__,TextureSizeCase *this)

{
  byte bVar1;
  ostream *poVar2;
  char *pcVar3;
  ostringstream frag;
  ostream local_190;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190);
  poVar2 = std::operator<<(&local_190,"#version 300 es\n");
  std::operator<<(poVar2,"layout(location = 0) out mediump vec4 o_color;\n");
  bVar1 = this->m_isVertexCase;
  if ((bool)bVar1 == true) {
    std::operator<<(&local_190,"in mediump vec4 v_color;\n");
    bVar1 = this->m_isVertexCase;
  }
  if ((bVar1 & 1) == 0) {
    poVar2 = std::operator<<(&local_190,"uniform highp ");
    poVar2 = std::operator<<(poVar2,this->m_samplerTypeStr);
    std::operator<<(poVar2," u_sampler;\n");
    poVar2 = std::operator<<(&local_190,"uniform highp ivec");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_has3DSize | 2);
    std::operator<<(poVar2," u_texSize;\n");
    std::operator<<(&local_190,"uniform highp int u_lod;\n");
  }
  std::operator<<(&local_190,"void main()\n{\n");
  pcVar3 = 
  "\to_color = (textureSize(u_sampler, u_lod) == u_texSize ? vec4(1.0, 1.0, 1.0, 1.0) : vec4(0.0, 0.0, 0.0, 1.0));\n"
  ;
  if (this->m_isVertexCase != false) {
    pcVar3 = "\to_color = v_color;\n";
  }
  std::operator<<(&local_190,pcVar3);
  std::operator<<(&local_190,"}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string TextureSizeCase::genFragmentShader() const
{
	std::ostringstream	frag;

	frag << "#version 300 es\n"
			<< "layout(location = 0) out mediump vec4 o_color;\n";

	if (m_isVertexCase)
			frag << "in mediump vec4 v_color;\n";

	if (!m_isVertexCase)
	{
		frag << "uniform highp " << m_samplerTypeStr << " u_sampler;\n";
		frag << "uniform highp ivec" << (m_has3DSize ? 3 : 2) << " u_texSize;\n";
		frag << "uniform highp int u_lod;\n";
	}

	frag << "void main()\n{\n";

	if (!m_isVertexCase)
		frag << "	o_color = (textureSize(u_sampler, u_lod) == u_texSize ? vec4(1.0, 1.0, 1.0, 1.0) : vec4(0.0, 0.0, 0.0, 1.0));\n";
	else
		frag << "	o_color = v_color;\n";

	frag << "}\n";

	return frag.str();
}